

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmloutput.cpp
# Opt level: O1

XmlOutput * __thiscall XmlOutput::operator<<(XmlOutput *this,xml_output *o)

{
  QChar QVar1;
  int iVar2;
  storage_type *psVar3;
  QArrayData *pQVar4;
  long in_FS_OFFSET;
  QByteArrayView QVar5;
  QAnyStringView QVar6;
  QAnyStringView QVar7;
  QAnyStringView QVar8;
  QByteArrayView QVar9;
  QAnyStringView QVar10;
  QAnyStringView QVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QAnyStringView QVar14;
  QByteArrayView QVar15;
  QAnyStringView QVar16;
  QAnyStringView QVar17;
  QArrayData *local_a8;
  QString *pQStack_a0;
  undefined1 *local_98;
  QStringBuilder<const_char_(&)[2],_QString_&> local_88;
  undefined1 *local_78;
  QString local_68;
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  switch(o->xo_type) {
  case tRaw:
    addRaw(this,&o->xo_text);
    break;
  case tDeclaration:
    addDeclaration(this,&o->xo_text,&o->xo_value);
    break;
  case tTag:
    newTagOpen(this,&o->xo_text);
    break;
  case tTagValue:
    QVar9.m_data = (storage_type *)0x7;
    QVar9.m_size = (qsizetype)&local_48;
    QString::fromUtf8(QVar9);
    local_88.a = (char (*) [2])local_48.d.d;
    local_88.b = (QString *)local_48.d.ptr;
    local_78 = (undefined1 *)local_48.d.size;
    QVar10.m_size = (size_t)&local_88;
    QVar10.field_0.m_data = &local_68;
    QString::arg_impl(QVar10,(int)(this->currentIndent).d.ptr,
                      (QChar)(char16_t)(this->currentIndent).d.size);
    QVar11.m_size = (size_t)&local_68;
    QVar11.field_0.m_data = &local_48;
    QString::arg_impl(QVar11,(int)(o->xo_text).d.ptr,(QChar)(char16_t)(o->xo_text).d.size);
    addRaw(this,&local_48);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((QArrayData *)local_88.a != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)*local_88.a)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)*local_88.a)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)*local_88.a)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_88.a,2,0x10);
      }
    }
    doConversion(&local_48,this,&o->xo_value);
    addRaw(this,&local_48);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
    QVar12.m_data = (storage_type *)0x5;
    QVar12.m_size = (qsizetype)&local_48;
    QString::fromUtf8(QVar12);
    local_68.d.ptr = local_48.d.ptr;
    local_68.d.size = local_48.d.size;
    iVar2 = (int)(o->xo_text).d.ptr;
    QVar1.ucs = (char16_t)(o->xo_text).d.size;
    goto LAB_0025f65a;
  case tValueTag:
    doConversion(&local_48,this,&o->xo_text);
    addRaw(this,&local_48);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
    this->format = NoNewLine;
    closeTag(this);
    this->format = NewLine;
    break;
  case tCloseTag:
    if ((o->xo_value).d.size == 0) {
      if ((o->xo_text).d.size == 0) {
        closeTag(this);
      }
      else {
        closeTo(this,&o->xo_text);
      }
    }
    else {
      closeAll(this);
    }
    break;
  case tAttribute:
    addAttribute(this,&o->xo_text,&o->xo_value);
    break;
  case tAttributeTag:
    addAttributeTag(this,&o->xo_text,&o->xo_value);
    break;
  case tData:
    if ((o->xo_text).d.size == 0) {
      if (Tag < this->currentState) {
        QTextStream::operator<<(this->xmlFile,'>');
        this->currentState = Tag;
      }
      break;
    }
    local_68.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_68.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_68.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    doConversion(&local_68,this,&o->xo_text);
    local_88.b = &this->currentIndent;
    local_88.a = (char (*) [2])0x2ab0d8;
    QStringBuilder<const_char_(&)[2],_QString_&>::convertTo<QString>(&local_48,&local_88);
    QString::replace((QChar)(char16_t)&local_68,(QString *)0xa,(CaseSensitivity)&local_48);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
    QVar15.m_data = (storage_type *)0x5;
    QVar15.m_size = (qsizetype)&local_48;
    QString::fromUtf8(QVar15);
    local_a8 = &(local_48.d.d)->super_QArrayData;
    pQStack_a0 = (QString *)local_48.d.ptr;
    local_98 = (undefined1 *)local_48.d.size;
    QVar16.m_size = (size_t)&local_a8;
    QVar16.field_0.m_data = &local_88;
    QString::arg_impl(QVar16,(int)(this->currentIndent).d.ptr,
                      (QChar)(char16_t)(this->currentIndent).d.size);
    QVar17.m_size = (size_t)&local_88;
    QVar17.field_0.m_data = &local_48;
    QString::arg_impl(QVar17,(int)local_68.d.ptr,(QChar)(char16_t)local_68.d.size);
    addRaw(this,&local_48);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((QArrayData *)local_88.a != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)*local_88.a)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)*local_88.a)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)*local_88.a)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_88.a,2,0x10);
      }
    }
    if (local_a8 != (QArrayData *)0x0) {
      LOCK();
      (local_a8->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_a8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      local_48.d.d = (Data *)local_a8;
      if ((local_a8->ref_)._q_value.super___atomic_base<int>._M_i != 0) goto LAB_0025f694;
      goto LAB_0025f685;
    }
    goto LAB_0025f694;
  case tImport:
    QVar5.m_data = (storage_type *)0x15;
    QVar5.m_size = (qsizetype)&local_48;
    QString::fromUtf8(QVar5);
    local_a8 = &(local_48.d.d)->super_QArrayData;
    pQStack_a0 = (QString *)local_48.d.ptr;
    local_98 = (undefined1 *)local_48.d.size;
    QVar6.m_size = (size_t)&local_a8;
    QVar6.field_0.m_data = &local_88;
    QString::arg_impl(QVar6,(int)(this->currentIndent).d.ptr,
                      (QChar)(char16_t)(this->currentIndent).d.size);
    QVar7.m_size = (size_t)&local_88;
    QVar7.field_0.m_data = &local_68;
    QString::arg_impl(QVar7,(int)(o->xo_text).d.ptr,(QChar)(char16_t)(o->xo_text).d.size);
    QVar8.m_size = (size_t)&local_68;
    QVar8.field_0.m_data = &local_48;
    QString::arg_impl(QVar8,(int)(o->xo_value).d.ptr,(QChar)(char16_t)(o->xo_value).d.size);
    addRaw(this,&local_48);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((QArrayData *)local_88.a != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)*local_88.a)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)*local_88.a)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)*local_88.a)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_88.a,2,0x10);
      }
    }
    if (local_a8 == (QArrayData *)0x0) break;
    LOCK();
    (local_a8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_a8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    pQVar4 = local_a8;
    if ((local_a8->ref_)._q_value.super___atomic_base<int>._M_i != 0) break;
    goto LAB_0025f6a8;
  case tComment:
    psVar3 = (storage_type *)0x9;
    goto LAB_0025f623;
  case tCDATA:
    psVar3 = (storage_type *)0x10;
LAB_0025f623:
    local_68.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_68.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    local_68.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    QVar13.m_data = psVar3;
    QVar13.m_size = (qsizetype)&local_48;
    QString::fromUtf8(QVar13);
    local_68.d.ptr = local_48.d.ptr;
    local_68.d.size = local_48.d.size;
    iVar2 = (int)(o->xo_text).d.ptr;
    QVar1.ucs = (char16_t)(o->xo_text).d.size;
LAB_0025f65a:
    QVar14.field_0.m_data = &local_48;
    QVar14.m_size = &local_68;
    local_68.d.d = local_48.d.d;
    QString::arg_impl(QVar14,iVar2,QVar1);
    addRaw(this,&local_48);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
LAB_0025f685:
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
LAB_0025f694:
    if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      pQVar4 = &(local_68.d.d)->super_QArrayData;
      if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
LAB_0025f6a8:
        QArrayData::deallocate(pQVar4,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return this;
}

Assistant:

XmlOutput& XmlOutput::operator<<(const xml_output& o)
{
    switch(o.xo_type) {
    case tNothing:
        break;
    case tRaw:
        addRaw(o.xo_text);
        break;
    case tDeclaration:
        addDeclaration(o.xo_text, o.xo_value);
        break;
    case tTag:
        newTagOpen(o.xo_text);
        break;
    case tTagValue:
        addRaw(QString("\n%1<%2>").arg(currentIndent).arg(o.xo_text));
        addRaw(doConversion(o.xo_value));
        addRaw(QString("</%1>").arg(o.xo_text));
        break;
    case tValueTag:
        addRaw(doConversion(o.xo_text));
        setFormat(NoNewLine);
        closeTag();
        setFormat(NewLine);
        break;
    case tImport:
        addRaw(QString("\n%1<Import %2=\"%3\" />").arg(currentIndent).arg(o.xo_text).arg(o.xo_value));
        break;
    case tCloseTag:
        if (o.xo_value.size())
            closeAll();
        else if (o.xo_text.size())
            closeTo(o.xo_text);
        else
            closeTag();
        break;
    case tAttribute:
        addAttribute(o.xo_text, o.xo_value);
        break;
    case tAttributeTag:
        addAttributeTag(o.xo_text, o.xo_value);
        break;
    case tData:
        {
            // Special case to be able to close tag in normal
            // way ("</tag>", not "/>") without using addRaw()..
            if (!o.xo_text.size()) {
                closeOpen();
                break;
            }
            QString output = doConversion(o.xo_text);
            output.replace('\n', "\n" + currentIndent);
            addRaw(QString("\n%1%2").arg(currentIndent).arg(output));
        }
        break;
    case tComment:
        {
            QString output("<!--%1-->");
            addRaw(output.arg(o.xo_text));
        }
        break;
    case tCDATA:
        {
            QString output("<![CDATA[\n%1\n]]>");
            addRaw(output.arg(o.xo_text));
        }
        break;
    }
    return *this;
}